

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::SwapInlinedStringDonated
          (Reflection *this,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  uint *puVar1;
  bool bVar2;
  char cVar3;
  uint32_t uVar4;
  uint uVar5;
  ulong uVar6;
  undefined7 extraout_var;
  string *psVar7;
  ulong uVar8;
  uint *puVar9;
  char unaff_BPL;
  undefined1 *puVar10;
  ReflectionSchema *this_00;
  undefined1 local_40 [16];
  
  uVar6 = (lhs->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    uVar6 = *(ulong *)(uVar6 & 0xfffffffffffffffe);
  }
  uVar8 = (rhs->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar8 & 1) != 0) {
    uVar8 = *(ulong *)(uVar8 & 0xfffffffffffffffe);
  }
  if (uVar6 != uVar8) {
    return;
  }
  bVar2 = IsInlinedStringDonated(this,lhs,field);
  this_00 = (ReflectionSchema *)(CONCAT71(extraout_var,bVar2) & 0xffffffff);
  cVar3 = IsInlinedStringDonated(this,rhs,field);
  if (SUB81(this_00,0) == (bool)cVar3) {
    return;
  }
  if ((this->schema_).inlined_string_donated_offset_ == -1) {
    SwapInlinedStringDonated();
    cVar3 = unaff_BPL;
LAB_00282cb8:
    puVar10 = local_40;
    SwapInlinedStringDonated();
LAB_00282cc2:
    psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)puVar10,0,"lhs_array[0] & 0x1u == 0u");
  }
  else {
    this_00 = &this->schema_;
    uVar4 = internal::ReflectionSchema::InlinedStringDonatedOffset(this_00);
    if ((this->schema_).inlined_string_donated_offset_ == -1) goto LAB_00282cb8;
    lhs = (Message *)((long)&(lhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar4);
    uVar4 = internal::ReflectionSchema::InlinedStringDonatedOffset(this_00);
    this = (Reflection *)(ulong)uVar4;
    uVar5 = *(uint *)&(lhs->super_MessageLite)._vptr_MessageLite;
    puVar10 = (undefined1 *)((ulong)uVar5 & 1);
    if ((uVar5 & 1) != 0) goto LAB_00282cc2;
    psVar7 = (string *)0x0;
  }
  if (psVar7 == (string *)0x0) {
    puVar9 = (uint *)((long)&(rhs->super_MessageLite)._vptr_MessageLite + ((ulong)this & 0xffffffff)
                     );
    if ((*puVar9 & 1) == 0) {
      psVar7 = (string *)0x0;
    }
    else {
      psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((ulong)*puVar9 & 1,0,"rhs_array[0] & 0x1u == 0u");
    }
    if (psVar7 == (string *)0x0) {
      uVar4 = internal::ReflectionSchema::InlinedStringIndex(this_00,field);
      if (uVar4 == 0) {
        psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>(0,0,"index > 0u");
      }
      else {
        psVar7 = (string *)0x0;
      }
      if (psVar7 == (string *)0x0) {
        uVar5 = 1 << ((byte)uVar4 & 0x1f);
        if (cVar3 == '\0') {
          puVar1 = (uint *)((long)&(lhs->super_MessageLite)._vptr_MessageLite +
                           (ulong)(uVar4 >> 5) * 4);
          *puVar1 = *puVar1 & ~uVar5;
          puVar9[uVar4 >> 5] = puVar9[uVar4 >> 5] | uVar5;
        }
        else {
          puVar1 = (uint *)((long)&(lhs->super_MessageLite)._vptr_MessageLite +
                           (ulong)(uVar4 >> 5) * 4);
          *puVar1 = *puVar1 | uVar5;
          puVar9[uVar4 >> 5] = puVar9[uVar4 >> 5] & ~uVar5;
        }
        return;
      }
      goto LAB_00282d18;
    }
  }
  else {
    SwapInlinedStringDonated();
  }
  SwapInlinedStringDonated();
LAB_00282d18:
  SwapInlinedStringDonated();
}

Assistant:

void Reflection::SwapInlinedStringDonated(Message* lhs, Message* rhs,
                                          const FieldDescriptor* field) const {
  Arena* lhs_arena = lhs->GetArena();
  Arena* rhs_arena = rhs->GetArena();
  // If arenas differ, inined string fields are swapped by copying values.
  // Donation status should not be swapped.
  if (lhs_arena != rhs_arena) {
    return;
  }
  bool lhs_donated = IsInlinedStringDonated(*lhs, field);
  bool rhs_donated = IsInlinedStringDonated(*rhs, field);
  if (lhs_donated == rhs_donated) {
    return;
  }
  // If one is undonated, both must have already registered ArenaDtor.
  uint32_t* lhs_array = MutableInlinedStringDonatedArray(lhs);
  uint32_t* rhs_array = MutableInlinedStringDonatedArray(rhs);
  ABSL_CHECK_EQ(lhs_array[0] & 0x1u, 0u);
  ABSL_CHECK_EQ(rhs_array[0] & 0x1u, 0u);
  // Swap donation status bit.
  uint32_t index = schema_.InlinedStringIndex(field);
  ABSL_DCHECK_GT(index, 0u);
  if (rhs_donated) {
    SetInlinedStringDonated(index, lhs_array);
    ClearInlinedStringDonated(index, rhs_array);
  } else {  // lhs_donated
    ClearInlinedStringDonated(index, lhs_array);
    SetInlinedStringDonated(index, rhs_array);
  }
}